

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O2

void __thiscall xray_re::cse_abstract::cse_abstract(cse_abstract *this)

{
  this->_vptr_cse_abstract = (_func_int **)&PTR__cse_abstract_002359b0;
  (this->m_s_name_replace)._M_dataplus._M_p = (pointer)&(this->m_s_name_replace).field_2;
  (this->m_s_name_replace)._M_string_length = 0;
  (this->m_s_name_replace).field_2._M_local_buf[0] = '\0';
  this->m_version = 0;
  this->m_script_version = 0;
  this->m_respawn_time = 0;
  this->m_id = 0xffff;
  this->m_id_parent = 0xffff;
  this->m_id_phantom = 0xffff;
  (this->m_s_name)._M_dataplus._M_p = (pointer)&(this->m_s_name).field_2;
  (this->m_s_name)._M_string_length = 0;
  (this->m_s_name).field_2._M_local_buf[0] = '\0';
  this->m_s_game_id = '\0';
  this->m_s_rp = 0xfe;
  this->m_s_flags = 0;
  this->m_cs_unk1_u16 = 0xffff;
  (this->m_ini_string)._M_dataplus._M_p = (pointer)&(this->m_ini_string).field_2;
  (this->m_ini_string)._M_string_length = 0;
  (this->m_ini_string).field_2._M_local_buf[0] = '\0';
  this->m_spawn_id = 0xffff;
  (this->m_clsid).field_0.quad = 0;
  std::
  stack<xray_re::cse_abstract::sm_record,std::deque<xray_re::cse_abstract::sm_record,std::allocator<xray_re::cse_abstract::sm_record>>>
  ::
  stack<std::deque<xray_re::cse_abstract::sm_record,std::allocator<xray_re::cse_abstract::sm_record>>,void>
            (&this->m_markers);
  *(undefined8 *)&(this->m_o_position).field_0 = 0;
  *(undefined8 *)((long)&(this->m_o_position).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_o_angle).field_0 + 4) = 0;
  return;
}

Assistant:

cse_abstract::cse_abstract():
	m_version(0), m_script_version(0), m_respawn_time(0),
	m_id(UNDEF16), m_id_parent(UNDEF16), m_id_phantom(UNDEF16),
	m_s_game_id(GAME_ANY), m_s_rp(0xfe), m_s_flags(0),
	m_cs_unk1_u16(UNDEF16),
	m_spawn_id(UNDEF16)
{
	m_o_position.set();
	m_o_angle.set();
}